

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

bool __thiscall
flatbuffers::SymbolTable<flatbuffers::FieldDef>::Add
          (SymbolTable<flatbuffers::FieldDef> *this,string *name,FieldDef *e)

{
  _Rb_tree_header *p_Var1;
  mapped_type pFVar2;
  iterator iVar3;
  mapped_type *ppFVar4;
  mapped_type local_30;
  
  local_30 = e;
  std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>::
  emplace_back<flatbuffers::FieldDef*&>
            ((vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>> *)&this->vec,
             &local_30);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                  *)this,name);
  pFVar2 = local_30;
  p_Var1 = &(this->dict)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    ppFVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
              ::operator[](&this->dict,name);
    *ppFVar4 = pFVar2;
  }
  return (_Rb_tree_header *)iVar3._M_node != p_Var1;
}

Assistant:

bool Add(const std::string &name, T *e) {
    vec.emplace_back(e);
    auto it = dict.find(name);
    if (it != dict.end()) return true;
    dict[name] = e;
    return false;
  }